

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanCommandBuffer::CopyImage
          (VulkanCommandBuffer *this,VkImage srcImage,VkImageLayout srcImageLayout,VkImage dstImage,
          VkImageLayout dstImageLayout,uint32_t regionCount,VkImageCopy *pRegions)

{
  Char *Message;
  undefined1 local_50 [8];
  string msg;
  uint32_t regionCount_local;
  VkImageLayout dstImageLayout_local;
  VkImage dstImage_local;
  VkImageLayout srcImageLayout_local;
  VkImage srcImage_local;
  VulkanCommandBuffer *this_local;
  
  msg.field_2._8_4_ = regionCount;
  msg.field_2._12_4_ = dstImageLayout;
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              ((string *)local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",(char (*) [32])dstImage);
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"CopyImage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x20e);
    std::__cxx11::string::~string((string *)local_50);
  }
  EndRenderScope(this);
  FlushBarriers(this);
  (*vkCmdCopyImage)(this->m_VkCmdBuffer,srcImage,srcImageLayout,dstImage,msg.field_2._12_4_,
                    msg.field_2._8_4_,pRegions);
  return;
}

Assistant:

__forceinline void CopyImage(VkImage            srcImage,
                                 VkImageLayout      srcImageLayout,
                                 VkImage            dstImage,
                                 VkImageLayout      dstImageLayout,
                                 uint32_t           regionCount,
                                 const VkImageCopy* pRegions)
    {
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        // Copy operations must be performed outside of render pass.
        EndRenderScope();
        FlushBarriers();
        vkCmdCopyImage(m_VkCmdBuffer, srcImage, srcImageLayout, dstImage, dstImageLayout, regionCount, pRegions);
    }